

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_NtkDupDfs_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  int iObj_00;
  Wlc_Obj_t *p_00;
  
  iVar1 = Vec_IntEntry(&p->vCopies,iObj);
  if (iVar1 != 0) {
    return;
  }
  p_00 = Wlc_NtkObj(p,iObj);
  for (iVar1 = 0; iVar1 < (int)p_00->nFanins; iVar1 = iVar1 + 1) {
    iObj_00 = Wlc_ObjFaninId(p_00,iVar1);
    Wlc_NtkDupDfs_rec(pNew,p,iObj_00,vFanins);
  }
  Wlc_ObjDup(pNew,p,iObj,vFanins);
  return;
}

Assistant:

void Wlc_NtkDupDfs_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
    Wlc_ObjDup( pNew, p, iObj, vFanins );
}